

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.h
# Opt level: O0

int __thiscall IntVar::size(IntVar *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  IntVar *in_RDI;
  int i;
  int count;
  int local_18;
  int local_14;
  int local_4;
  
  bVar1 = isFixed(in_RDI);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    local_14 = 2;
    local_18 = Tint::operator_cast_to_int(&in_RDI->min);
    while( true ) {
      local_18 = local_18 + 1;
      iVar3 = Tint::operator_cast_to_int(&in_RDI->max);
      if (iVar3 <= local_18) break;
      cVar2 = Tchar::operator_cast_to_char(in_RDI->vals + local_18);
      local_14 = cVar2 + local_14;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int size() const {
#ifdef HAS_VAR_IMPACT
			if (!vals) return max + 1 - min;
#else
		assert(vals);
#endif
#if INT_DOMAIN_LIST
			return vals_count;
#else
		if (isFixed()) {
			return 1;
		}
		int count = 2;
		for (int i = min + 1; i < max; ++i) {
			count += vals[i];
		}
		return count;
#endif
		}